

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  unsigned_short *in_R8;
  int iVar6;
  long lStack_40;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar2 = 0;
  iVar6 = 0;
  uVar4 = bVar1 - 5;
  if (uVar4 < 0x14) {
    switch((uint)bVar1) {
    case 5:
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
      iVar2 = iVar6;
      if (iVar3 == 0) goto switchD_0015382c_caseD_8;
      ptr = ptr + 2;
      break;
    case 6:
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      iVar3 = (*enc[3].scanners[0])
                        (enc,ptr,end,
                         (char **)((long)&switchD_0015382c::switchdataD_001c8bb8 +
                                  (long)(int)(&switchD_0015382c::switchdataD_001c8bb8)[uVar4]));
      iVar2 = iVar6;
      if (iVar3 == 0) goto switchD_0015382c_caseD_8;
      ptr = ptr + 3;
      break;
    case 7:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      iVar3 = (*enc[3].scanners[1])
                        (enc,ptr,end,
                         (char **)((long)&switchD_0015382c::switchdataD_001c8bb8 +
                                  (long)(int)(&switchD_0015382c::switchdataD_001c8bb8)[uVar4]));
      iVar2 = iVar6;
      if (iVar3 == 0) goto switchD_0015382c_caseD_8;
      ptr = ptr + 4;
      break;
    default:
      goto switchD_0015382c_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0015382c_caseD_9;
    case 0x16:
    case 0x18:
      ptr = ptr + 1;
    }
    while( true ) {
      if (ptr == end) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      pcVar5 = (char *)(ulong)(bVar1 - 0x18);
      lStack_40 = 1;
      if (3 < bVar1 - 0x18) break;
LAB_001538f2:
      ptr = (char *)((long)ptr + lStack_40);
    }
    if (bVar1 == 5) {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar2 = (*enc[2].isPublicId)(enc,ptr,pcVar5,(char **)0x1);
      lStack_40 = 2;
LAB_001538e9:
      if (iVar2 != 0) goto LAB_001538f2;
    }
    else {
      if (bVar1 == 6) {
        if ((long)end - (long)ptr < 3) {
          return -2;
        }
        iVar2 = (*enc[2].utf8Convert)(enc,(char **)ptr,pcVar5,(char **)0x1,(char *)in_R8);
        lStack_40 = 3;
        goto LAB_001538e9;
      }
      if (bVar1 == 7) {
        if ((long)end - (long)ptr < 4) {
          return -2;
        }
        iVar2 = (*enc[2].utf16Convert)(enc,(char **)ptr,pcVar5,(unsigned_short **)0x1,in_R8);
        lStack_40 = 4;
        goto LAB_001538e9;
      }
      if (bVar1 == 0x16) goto LAB_001538f2;
      if (bVar1 == 0x12) {
        ptr = (char *)((long)ptr + 1);
        iVar2 = 0x1c;
        goto switchD_0015382c_caseD_8;
      }
    }
    iVar2 = 0;
  }
  else {
    if (bVar1 != 0x1e) goto switchD_0015382c_caseD_8;
switchD_0015382c_caseD_9:
    iVar2 = 0x16;
  }
switchD_0015382c_caseD_8:
  *nextTokPtr = ptr;
  return iVar2;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}